

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mime.h
# Opt level: O1

string * MimeTypes::get(string *__return_storage_ptr__,string *ext)

{
  size_t __n;
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  size_type *psVar4;
  bool bVar5;
  
  __n = ext->_M_string_length;
  psVar4 = &mimeType[0].mime._M_string_length;
  uVar3 = 0;
  bVar5 = false;
  while ((__n != psVar4[-4] ||
         ((__n != 0 && (iVar2 = bcmp((ext->_M_dataplus)._M_p,(void *)psVar4[-5],__n), iVar2 != 0))))
        ) {
    bVar5 = 0x155 < uVar3;
    uVar3 = uVar3 + 1;
    psVar4 = psVar4 + 8;
    if (uVar3 == 0x157) {
LAB_00113d04:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (((string *)(psVar4 + -1))->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + *psVar4);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  goto LAB_00113d04;
}

Assistant:

static std::string get(std::string ext)
    {
        for (int i = 0; i < MIME_SIZE; i++) {
            if (ext == MimeTypes::mimeType[i].extension) return MimeTypes::mimeType[i].mime;
        }
        return "";
    }